

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

void __thiscall
TEST_GlobalSimpleStringMemoryAccountant_reportUseCaches_Test::
TEST_GlobalSimpleStringMemoryAccountant_reportUseCaches_Test
          (TEST_GlobalSimpleStringMemoryAccountant_reportUseCaches_Test *this)

{
  TEST_GlobalSimpleStringMemoryAccountant_reportUseCaches_Test *this_local;
  
  memset(this,0,0x68);
  TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant::
  TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant
            (&this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant);
  (this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GlobalSimpleStringMemoryAccountant_reportUseCaches_Test_003e8458;
  return;
}

Assistant:

TEST(GlobalSimpleStringMemoryAccountant, reportUseCaches)
{
    size_t caches[] = {32};
    accountant.useCacheSizes(caches, 1);
    SimpleString str;
    accountant.start();
    str += "More";
    accountant.stop();
    STRCMP_CONTAINS("32                   1                1                 1", accountant.report().asCharString());
}